

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_result_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  int *piVar1;
  t_field *tfield;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  t_cpp_generator *this_00;
  pointer pptVar5;
  string name;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string(local_d0,(string *)CONCAT44(extraout_var,iVar3));
  if (this->gen_templates_ == true) {
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_130);
    poVar4 = std::operator<<(poVar4,"template <class Protocol_>");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
    poVar4 = std::operator<<(poVar4,"::write(Protocol_* oprot) const {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar4 = std::operator<<(poVar4,"::write(::apache::thrift::protocol::TProtocol* oprot) const {")
    ;
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,"uint32_t xfer = 0;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"xfer += oprot->writeStructBegin(\"");
  poVar4 = std::operator<<(poVar4,local_d0);
  poVar4 = std::operator<<(poVar4,"\");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar2 = true;
  for (pptVar5 = (tstruct->members_in_id_order_).
                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (bVar2) {
      poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_130);
      std::operator<<(poVar4,"if ");
      std::__cxx11::string::~string((string *)&local_130);
    }
    else {
      std::operator<<(out," else if ");
    }
    poVar4 = std::operator<<(out,"(this->__isset.");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<(poVar4,") {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_130);
    poVar4 = std::operator<<(poVar4,"xfer += oprot->writeFieldBegin(");
    poVar4 = std::operator<<(poVar4,"\"");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar5)->name_);
    this_00 = (t_cpp_generator *)0x2df5f6;
    poVar4 = std::operator<<(poVar4,"\", ");
    type_to_enum_abi_cxx11_(&local_110,this_00,(*pptVar5)->type_);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(*pptVar5)->key_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    tfield = *pptVar5;
    if (pointers) {
      std::__cxx11::string::string((string *)&local_90,"(*(this->",(allocator *)&local_130);
      std::__cxx11::string::string((string *)&local_50,"))",(allocator *)&local_110);
      generate_serialize_field(this,out,tfield,&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,"this->",(allocator *)&local_130);
      std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_110);
      generate_serialize_field(this,out,tfield,&local_b0,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"xfer += oprot->writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"}");
    bVar2 = false;
  }
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_130);
  poVar4 = std::operator<<(poVar4,"xfer += oprot->writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_110);
  poVar4 = std::operator<<(poVar4,"xfer += oprot->writeStructEnd();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"return xfer;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_result_writer(ostream& out,
                                                    t_struct* tstruct,
                                                    bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << endl << indent() << "uint32_t xfer = 0;" << endl << endl;

  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this->__isset." << (*f_iter)->get_name() << ") {" << endl;

    indent_up();

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }

  // Write the struct map
  out << endl << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent() << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}